

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Percentile.cpp
# Opt level: O0

void __thiscall Percentile::modelToQueries(Percentile *this)

{
  bool bVar1;
  void *pvVar2;
  size_t *psVar3;
  element_type *peVar4;
  Query *q;
  bitset<100UL> *__position;
  long in_RDI;
  Query *query;
  Aggregate *agg_1;
  size_t var;
  Query *count;
  Aggregate *agg;
  Query *in_stack_fffffffffffffdc8;
  QueryCompiler *in_stack_fffffffffffffdd0;
  bitset<100UL> *in_stack_fffffffffffffdd8;
  vector<Aggregate_*,_std::allocator<Aggregate_*>_> *in_stack_fffffffffffffde0;
  Query *this_00;
  byte local_211;
  QueryCompiler local_1e0;
  byte local_111;
  reference local_110;
  reference local_100;
  ulong local_f0;
  size_t *local_e8;
  void *local_10;
  
  pvVar2 = operator_new__(0x328);
  *(void **)(in_RDI + 0x98) = pvVar2;
  pvVar2 = operator_new(0x30);
  Aggregate::Aggregate((Aggregate *)in_stack_fffffffffffffdd0);
  local_10 = pvVar2;
  std::bitset<1500UL>::bitset((bitset<1500UL> *)0x24e4dd);
  std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>::push_back
            ((vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_> *)
             in_stack_fffffffffffffdd0,(value_type *)in_stack_fffffffffffffdc8);
  psVar3 = (size_t *)operator_new(0x30);
  Query::Query((Query *)in_stack_fffffffffffffdd0);
  local_e8 = psVar3;
  peVar4 = std::__shared_ptr_access<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x24e526);
  *local_e8 = peVar4->_root->_id;
  std::vector<Aggregate_*,_std::allocator<Aggregate_*>_>::push_back
            (in_stack_fffffffffffffde0,(value_type *)in_stack_fffffffffffffdd8);
  std::__shared_ptr_access<QueryCompiler,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<QueryCompiler,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x24e55f);
  QueryCompiler::addQuery(in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
  *(size_t **)(*(long *)(in_RDI + 0x98) + 800) = local_e8;
  for (local_f0 = 0; local_f0 < 100; local_f0 = local_f0 + 1) {
    std::bitset<100UL>::operator[](in_stack_fffffffffffffdd8,(size_t)in_stack_fffffffffffffdd0);
    bVar1 = std::bitset::reference::operator_cast_to_bool((reference *)in_stack_fffffffffffffdd0);
    local_111 = 0;
    local_211 = 0;
    if (bVar1) {
      std::bitset<100UL>::operator[](in_stack_fffffffffffffdd8,(size_t)in_stack_fffffffffffffdd0);
      local_111 = 1;
      bVar1 = std::bitset::reference::operator_cast_to_bool((reference *)in_stack_fffffffffffffdd0);
      local_211 = bVar1 ^ 0xff;
    }
    if ((local_111 & 1) != 0) {
      std::bitset<100UL>::reference::~reference(&local_110);
    }
    std::bitset<100UL>::reference::~reference(&local_100);
    if ((local_211 & 1) != 0) {
      q = (Query *)operator_new(0x30);
      Aggregate::Aggregate((Aggregate *)in_stack_fffffffffffffdd0);
      in_stack_fffffffffffffdd0 = &local_1e0;
      this_00 = q;
      local_1e0._viewCache._M_h._M_single_bucket = (__node_base_ptr)q;
      std::bitset<1500UL>::bitset((bitset<1500UL> *)0x24e6a1);
      std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>::push_back
                ((vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_> *)
                 in_stack_fffffffffffffdd0,(value_type *)q);
      __position = (bitset<100UL> *)operator_new(0x30);
      Query::Query((Query *)in_stack_fffffffffffffdd0);
      (__position->super__Base_bitset<2UL>)._M_w[0] =
           *(_WordT *)(*(long *)(in_RDI + 0x90) + local_f0 * 8);
      in_stack_fffffffffffffdd8 = __position;
      std::bitset<100UL>::set
                ((bitset<100UL> *)this_00,(size_t)__position,
                 SUB81((ulong)in_stack_fffffffffffffdd0 >> 0x38,0));
      std::vector<Aggregate_*,_std::allocator<Aggregate_*>_>::push_back
                ((vector<Aggregate_*,_std::allocator<Aggregate_*>_> *)this_00,
                 (value_type *)in_stack_fffffffffffffdd8);
      std::__shared_ptr_access<QueryCompiler,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                ((__shared_ptr_access<QueryCompiler,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x24e734);
      QueryCompiler::addQuery(in_stack_fffffffffffffdd0,q);
      *(bitset<100UL> **)(*(long *)(in_RDI + 0x98) + local_f0 * 8) = __position;
    }
  }
  return;
}

Assistant:

void Percentile::modelToQueries()
{
    varToQuery = new Query*[NUM_OF_VARIABLES+1];

    Aggregate* agg = new Aggregate();
    agg->_agg.push_back(prod_bitset());

    Query* count = new Query();
    count->_rootID = _td->_root->_id;
    count->_aggregates.push_back(agg);            
    _compiler->addQuery(count);

    varToQuery[NUM_OF_VARIABLES] = count;

    // Create a query & Aggregate
    for (size_t var = 0; var < NUM_OF_VARIABLES; ++var)
    {
        if (_isFeature[var] && !_isCategoricalFeature[var])
        {
            Aggregate* agg = new Aggregate();
            agg->_agg.push_back(prod_bitset());

            Query* query = new Query();
            query->_rootID = _queryRootIndex[var];
            query->_fVars.set(var);
            query->_aggregates.push_back(agg);
            
            _compiler->addQuery(query);

            varToQuery[var] = query;
        }
    }
}